

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::LValueReferenceExpression>
          (ConstraintExprVisitor *this,LValueReferenceExpression *expr)

{
  BinaryOperator BVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  ulong uVar2;
  FormalArgumentSymbol *pFVar3;
  bool bVar4;
  LanguageVersion LVar5;
  SubroutineKind SVar6;
  Expression *pEVar7;
  DistExpression *this_00;
  reference ppFVar8;
  ASTContext *this_01;
  Expression *in_RSI;
  SourceLocation in_RDI;
  FormalArgumentSymbol *arg;
  iterator __end6;
  iterator __begin6;
  ArgList *__range6;
  SubroutineSymbol *sub;
  CallExpression *call;
  Expression *left;
  DistVarVisitor distVisitor;
  BinaryExpression *binExpr;
  bool childrenHaveRand;
  RandMode mode;
  Symbol *sym;
  SubroutineSymbol *in_stack_fffffffffffffe58;
  Expression *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  byte bVar9;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  ASTContext *in_stack_fffffffffffffe78;
  SourceLocation in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  DiagCode code;
  bitmask<slang::ast::VariableFlags> local_162 [4];
  Expression *in_stack_fffffffffffffea8;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffeb0;
  ASTContext *in_stack_fffffffffffffeb8;
  DistVarVisitor local_e8;
  SourceLocation local_d8;
  SourceLocation local_d0;
  undefined4 local_c4;
  BinaryExpression *local_c0;
  SourceLocation local_b8;
  SourceLocation local_b0;
  undefined4 local_a4;
  SVInt local_a0;
  SourceLocation local_90;
  SourceLocation local_88;
  undefined4 local_7c;
  SVInt local_78;
  SourceLocation local_68;
  SourceLocation local_60;
  undefined4 local_54;
  SourceLocation local_50;
  SourceLocation local_48;
  undefined4 local_3e;
  byte local_39;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_28;
  RandMode local_24;
  Symbol *local_20;
  Expression *local_18;
  bool local_1;
  
  code = SUB84((ulong)in_stack_fffffffffffffe90 >> 0x20,0);
  if (((*(byte *)((long)in_RDI + 8) & 1) != 0) ||
     (local_18 = in_RSI, bVar4 = Expression::bad(in_stack_fffffffffffffe60),
     pFVar3 = stack0xfffffffffffffea0, bVar4)) {
    bVar4 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar4;
  }
  uVar2 = (ulong)stack0xfffffffffffffea0 >> 0x38;
  local_20 = Expression::getSymbolReference(in_stack_fffffffffffffea8,SUB81(uVar2,0));
  stack0xfffffffffffffea0 = pFVar3;
  if (local_20 != (Symbol *)0x0) {
    local_24 = ASTContext::getRandMode
                         (in_stack_fffffffffffffeb8,(Symbol *)in_stack_fffffffffffffeb0._M_current);
    if (local_24 != None) {
      *(undefined1 *)((long)in_RDI + 10) = 1;
    }
    if (((*(byte *)((long)in_RDI + 0xb) & 1) != 0) && (local_24 == RandC)) {
      local_28 = 0x390008;
      local_38 = (local_18->sourceRange).startLoc;
      local_30 = (local_18->sourceRange).endLoc;
      sourceRange.endLoc = in_stack_fffffffffffffe88;
      sourceRange.startLoc = in_RDI;
      ASTContext::addDiag(in_stack_fffffffffffffe78,code,sourceRange);
    }
  }
  local_39 = 0;
  this_01 = (ASTContext *)(ulong)(local_18->kind - IntegerLiteral);
  switch(this_01) {
  case (ASTContext *)0x0:
    Expression::as<slang::ast::IntegerLiteral>(local_18);
    IntegerLiteral::getValue((IntegerLiteral *)in_stack_fffffffffffffe58);
    bVar9 = SVInt::hasUnknown(&local_78);
    SVInt::~SVInt((SVInt *)CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe76,
                                                   CONCAT24(in_stack_fffffffffffffe74,
                                                            in_stack_fffffffffffffe70))));
    if ((bVar9 & 1) == 0) {
      return true;
    }
    local_7c = 0x500008;
    local_90 = (local_18->sourceRange).startLoc;
    local_88 = (local_18->sourceRange).endLoc;
    sourceRange_02.endLoc = in_stack_fffffffffffffe88;
    sourceRange_02.startLoc = in_RDI;
    ASTContext::addDiag(this_01,code,sourceRange_02);
    bVar4 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar4;
  case (ASTContext *)0x1:
  case (ASTContext *)0x2:
    ASTContext::getCompilation((ASTContext *)0x63bab4);
    LVar5 = Compilation::languageVersion((Compilation *)0x63babc);
    if ((int)LVar5 < 1) {
      local_54 = 0x2f0008;
      local_68 = (local_18->sourceRange).startLoc;
      local_60 = (local_18->sourceRange).endLoc;
      sourceRange_01.endLoc = in_stack_fffffffffffffe88;
      sourceRange_01.startLoc = in_RDI;
      ASTContext::addDiag(this_01,code,sourceRange_01);
      bVar4 = fail((ConstraintExprVisitor *)in_RDI);
      return bVar4;
    }
    break;
  case (ASTContext *)0x3:
    Expression::as<slang::ast::UnbasedUnsizedIntegerLiteral>(local_18);
    UnbasedUnsizedIntegerLiteral::getValue
              ((UnbasedUnsizedIntegerLiteral *)in_stack_fffffffffffffe88);
    bVar9 = SVInt::hasUnknown(&local_a0);
    SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(bVar9,CONCAT24(in_stack_fffffffffffffe74,
                                                            in_stack_fffffffffffffe70))));
    if ((bVar9 & 1) == 0) {
      return true;
    }
    local_a4 = 0x500008;
    local_b8 = (local_18->sourceRange).startLoc;
    local_b0 = (local_18->sourceRange).endLoc;
    sourceRange_03.endLoc = in_stack_fffffffffffffe88;
    sourceRange_03.startLoc = in_RDI;
    ASTContext::addDiag(this_01,code,sourceRange_03);
    bVar4 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar4;
  default:
    break;
  case (ASTContext *)0x7:
  case (ASTContext *)0x8:
    if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
      return true;
    }
    break;
  case (ASTContext *)0xa:
    local_c0 = Expression::as<slang::ast::BinaryExpression>(local_18);
    BVar1 = local_c0->op;
    if (1 < BVar1 - Equality) {
      if (BVar1 - CaseEquality < 2) {
LAB_0063bd16:
        local_c4 = 0x180008;
        local_d8 = (local_18->sourceRange).startLoc;
        local_d0 = (local_18->sourceRange).endLoc;
        sourceRange_04.endLoc = in_stack_fffffffffffffe88;
        sourceRange_04.startLoc = in_RDI;
        ASTContext::addDiag(this_01,code,sourceRange_04);
        bVar4 = fail((ConstraintExprVisitor *)in_RDI);
        return bVar4;
      }
      if (3 < BVar1 - GreaterThanEqual) {
        if (BVar1 - WildcardEquality < 2) goto LAB_0063bd16;
        if (3 < BVar1 - LogicalAnd) break;
      }
    }
    if ((local_39 & 1) != 0) {
      pEVar7 = BinaryExpression::left(local_c0);
      bVar4 = ValueExpressionBase::isKind(pEVar7->kind);
      if (bVar4) {
        BinaryExpression::left(local_c0);
        bVar4 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,(Expression *)in_RDI);
        if (!bVar4) {
          bVar4 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar4;
        }
      }
      pEVar7 = BinaryExpression::right(local_c0);
      bVar4 = ValueExpressionBase::isKind(pEVar7->kind);
      if (bVar4) {
        BinaryExpression::right(local_c0);
        bVar4 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,(Expression *)in_RDI);
        if (!bVar4) {
          bVar4 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar4;
        }
      }
    }
    break;
  case (ASTContext *)0x10:
  case (ASTContext *)0x20:
  case (ASTContext *)0x21:
  case (ASTContext *)0x23:
    local_3e = 0x180008;
    local_50 = (local_18->sourceRange).startLoc;
    local_48 = (local_18->sourceRange).endLoc;
    sourceRange_00.endLoc = in_stack_fffffffffffffe88;
    sourceRange_00.startLoc = in_RDI;
    ASTContext::addDiag(this_01,code,sourceRange_00);
    bVar4 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar4;
  case (ASTContext *)0x14:
    Expression::as<slang::ast::CallExpression>(local_18);
    SVar6 = CallExpression::getSubroutineKind
                      ((CallExpression *)
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    if (SVar6 == Task) {
      sourceRange_06.endLoc = in_stack_fffffffffffffe88;
      sourceRange_06.startLoc = in_RDI;
      ASTContext::addDiag(this_01,code,sourceRange_06);
      bVar4 = fail((ConstraintExprVisitor *)in_RDI);
      return bVar4;
    }
    bVar4 = CallExpression::isSystemCall((CallExpression *)0x63bfae);
    if (!bVar4) {
      std::get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                  *)0x63bfc7);
      SubroutineSymbol::getArguments(in_stack_fffffffffffffe58);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffe58);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffe6f,
                          CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
      while (bVar4 = __gnu_cxx::
                     operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe60,
                                (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe58), ((bVar4 ^ 0xffU) & 1) != 0) {
        ppFVar8 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  ::operator*((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)&stack0xfffffffffffffeb0);
        unique0x00012000 = *ppFVar8;
        bVar9 = 1;
        if (((unique0x00012000->direction != Out) &&
            (bVar9 = 1, unique0x00012000->direction != InOut)) &&
           (bVar9 = 0, unique0x00012000->direction == Ref)) {
          in_stack_fffffffffffffe60 = (Expression *)&(unique0x00012000->super_VariableSymbol).flags;
          bitmask<slang::ast::VariableFlags>::bitmask(local_162,Const);
          bVar4 = bitmask<slang::ast::VariableFlags>::has
                            ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe60,
                             (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe58);
          bVar9 = bVar4 ^ 0xff;
        }
        if ((bVar9 & 1) != 0) {
          sourceRange_07.endLoc = (local_18->sourceRange).startLoc;
          sourceRange_07.startLoc = in_RDI;
          ASTContext::addDiag(this_01,SUB84((local_18->sourceRange).endLoc,4),sourceRange_07);
          bVar4 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar4;
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      *)&stack0xfffffffffffffeb0);
      }
    }
    break;
  case (ASTContext *)0x1e:
    return true;
  case (ASTContext *)0x1f:
    DistVarVisitor::DistVarVisitor(&local_e8,*(ASTContext **)in_RDI);
    this_00 = Expression::as<slang::ast::DistExpression>(local_18);
    DistExpression::left(this_00);
    Expression::visit<slang::ast::DistVarVisitor&>
              (in_stack_fffffffffffffe60,(DistVarVisitor *)in_stack_fffffffffffffe58);
    if ((local_e8.anyRandVars & 1U) == 0) {
      sourceRange_05.endLoc = in_stack_fffffffffffffe88;
      sourceRange_05.startLoc = in_RDI;
      ASTContext::addDiag(this_01,code,sourceRange_05);
    }
    return true;
  }
  bVar4 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,(Expression *)in_RDI);
  if (bVar4) {
    local_1 = true;
  }
  else {
    local_1 = fail((ConstraintExprVisitor *)in_RDI);
  }
  return local_1;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }